

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void iadst16_stage9_avx2(__m256i *output,__m256i *x1)

{
  __m256i alVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  undefined1 auVar5 [32];
  
  lVar2 = (*x1)[1];
  lVar3 = (*x1)[2];
  lVar4 = (*x1)[3];
  (*output)[0] = (*x1)[0];
  (*output)[1] = lVar2;
  (*output)[2] = lVar3;
  (*output)[3] = lVar4;
  auVar5 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[8]);
  output[1] = alVar1;
  lVar2 = x1[0xc][1];
  lVar3 = x1[0xc][2];
  lVar4 = x1[0xc][3];
  output[2][0] = x1[0xc][0];
  output[2][1] = lVar2;
  output[2][2] = lVar3;
  output[2][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[4]);
  output[3] = alVar1;
  lVar2 = x1[6][1];
  lVar3 = x1[6][2];
  lVar4 = x1[6][3];
  output[4][0] = x1[6][0];
  output[4][1] = lVar2;
  output[4][2] = lVar3;
  output[4][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[0xe]);
  output[5] = alVar1;
  lVar2 = x1[10][1];
  lVar3 = x1[10][2];
  lVar4 = x1[10][3];
  output[6][0] = x1[10][0];
  output[6][1] = lVar2;
  output[6][2] = lVar3;
  output[6][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[2]);
  output[7] = alVar1;
  lVar2 = x1[3][1];
  lVar3 = x1[3][2];
  lVar4 = x1[3][3];
  output[8][0] = x1[3][0];
  output[8][1] = lVar2;
  output[8][2] = lVar3;
  output[8][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[0xb]);
  output[9] = alVar1;
  lVar2 = x1[0xf][1];
  lVar3 = x1[0xf][2];
  lVar4 = x1[0xf][3];
  output[10][0] = x1[0xf][0];
  output[10][1] = lVar2;
  output[10][2] = lVar3;
  output[10][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[7]);
  output[0xb] = alVar1;
  lVar2 = x1[5][1];
  lVar3 = x1[5][2];
  lVar4 = x1[5][3];
  output[0xc][0] = x1[5][0];
  output[0xc][1] = lVar2;
  output[0xc][2] = lVar3;
  output[0xc][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[0xd]);
  output[0xd] = alVar1;
  lVar2 = x1[9][1];
  lVar3 = x1[9][2];
  lVar4 = x1[9][3];
  output[0xe][0] = x1[9][0];
  output[0xe][1] = lVar2;
  output[0xe][2] = lVar3;
  output[0xe][3] = lVar4;
  alVar1 = (__m256i)vpsubsw_avx2(auVar5,(undefined1  [32])x1[1]);
  output[0xf] = alVar1;
  return;
}

Assistant:

static inline void iadst16_stage9_avx2(__m256i *output, __m256i *x1) {
  const __m256i __zero = _mm256_setzero_si256();
  output[0] = x1[0];
  output[1] = _mm256_subs_epi16(__zero, x1[8]);
  output[2] = x1[12];
  output[3] = _mm256_subs_epi16(__zero, x1[4]);
  output[4] = x1[6];
  output[5] = _mm256_subs_epi16(__zero, x1[14]);
  output[6] = x1[10];
  output[7] = _mm256_subs_epi16(__zero, x1[2]);
  output[8] = x1[3];
  output[9] = _mm256_subs_epi16(__zero, x1[11]);
  output[10] = x1[15];
  output[11] = _mm256_subs_epi16(__zero, x1[7]);
  output[12] = x1[5];
  output[13] = _mm256_subs_epi16(__zero, x1[13]);
  output[14] = x1[9];
  output[15] = _mm256_subs_epi16(__zero, x1[1]);
}